

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong helper_addsc_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  ulong uVar1;
  _Bool flag;
  uint64_t tempRt;
  uint64_t tempRs;
  uint64_t temp;
  CPUMIPSState_conflict5 *env_local;
  target_ulong rt_local;
  target_ulong rs_local;
  
  uVar1 = (rs & 0xffffffff) + (rt & 0xffffffff);
  set_DSPControl_carryflag((uVar1 & 0x100000000) != 0,env);
  return (long)(int)uVar1;
}

Assistant:

target_ulong helper_addsc(target_ulong rs, target_ulong rt, CPUMIPSState *env)
{
    uint64_t temp, tempRs, tempRt;
    bool flag;

    tempRs = (uint64_t)rs & MIPSDSP_LLO;
    tempRt = (uint64_t)rt & MIPSDSP_LLO;

    temp = tempRs + tempRt;
    flag = (temp & 0x0100000000ull) >> 32;
    set_DSPControl_carryflag(flag, env);

    return (target_long)(int32_t)(temp & MIPSDSP_LLO);
}